

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O0

deUint32 __thiscall glu::sl::ShaderParser::parseShaderStageList(ShaderParser *this)

{
  deUint32 dVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  deUint32 local_18;
  uint local_14;
  deUint32 stageFlag;
  deUint32 mask;
  ShaderParser *this_local;
  
  local_14 = 0;
  _stageFlag = this;
  assumeToken(this,TOKEN_LEFT_BRACE);
  advanceToken(this);
  dVar1 = getShaderStageLiteralFlag(this);
  local_14 = dVar1 | local_14;
  advanceToken(this);
  while (this->m_curToken != TOKEN_RIGHT_BRACE) {
    if (this->m_curToken == TOKEN_COMMA) {
      advanceToken(this);
      local_18 = getShaderStageLiteralFlag(this);
      if ((local_18 & local_14) != 0) {
        std::operator+(&local_38,"stage already set in the shader stage set: ",&this->m_curTokenStr)
        ;
        parseError(this,&local_38);
        std::__cxx11::string::~string((string *)&local_38);
      }
      local_14 = local_18 | local_14;
      advanceToken(this);
    }
    else {
      std::operator+(&local_68,"invalid shader stage set token: ",&this->m_curTokenStr);
      parseError(this,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
    }
  }
  advanceToken(this,TOKEN_RIGHT_BRACE);
  return local_14;
}

Assistant:

deUint32 ShaderParser::parseShaderStageList (void)
{
	deUint32 mask = 0;

	assumeToken(TOKEN_LEFT_BRACE);

	// don't allow 0-sized lists
	advanceToken();
	mask |= getShaderStageLiteralFlag();
	advanceToken();

	for (;;)
	{
		if (m_curToken == TOKEN_RIGHT_BRACE)
			break;
		else if (m_curToken == TOKEN_COMMA)
		{
			deUint32 stageFlag;
			advanceToken();

			stageFlag = getShaderStageLiteralFlag();
			if (stageFlag & mask)
				parseError(string("stage already set in the shader stage set: " + m_curTokenStr));

			mask |= stageFlag;
			advanceToken();
		}
		else
			parseError(string("invalid shader stage set token: " + m_curTokenStr));
	}
	advanceToken(TOKEN_RIGHT_BRACE);

	return mask;
}